

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwttests.c
# Opt level: O0

int main(void)

{
  int iVar1;
  wave_object obj_00;
  FILE *__stream;
  double *inp_00;
  double *oup;
  double *array;
  wt_object wt_00;
  char *name;
  double temp [1200];
  FILE *ifp;
  int local_40;
  int J;
  int i;
  int N;
  double *diff;
  double *out;
  double *inp;
  wt_object wt;
  wave_object obj;
  
  obj_00 = wave_init("db4");
  wave_summary(obj_00);
  __stream = fopen("../data/signal.txt","r");
  local_40 = 0;
  if (__stream != (FILE *)0x0) {
    while (iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf \n",temp + (long)local_40 + -1);
      local_40 = local_40 + 1;
    }
    fclose(__stream);
    inp_00 = (double *)malloc(0x588);
    oup = (double *)malloc(0x588);
    array = (double *)malloc(0x588);
    for (local_40 = 0; local_40 < 0xb1; local_40 = local_40 + 1) {
      inp_00[local_40] = temp[(long)local_40 + -1];
    }
    wt_00 = wt_init(obj_00,"modwt",0xb1,2);
    modwt(wt_00,inp_00);
    for (local_40 = 0; local_40 < wt_00->outlength; local_40 = local_40 + 1) {
      printf("%g ",wt_00->output[local_40]);
    }
    imodwt(wt_00,oup);
    for (local_40 = 0; local_40 < wt_00->siglength; local_40 = local_40 + 1) {
      array[local_40] = oup[local_40] - inp_00[local_40];
    }
    absmax(array,wt_00->siglength);
    printf("\n MAX %g \n");
    wt_summary(wt_00);
    wave_free(obj_00);
    wt_free(wt_00);
    free(inp_00);
    free(oup);
    free(array);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main() {
	wave_object obj;
	wt_object wt;
	double *inp, *out, *diff;
	int N, i, J;

	FILE *ifp;
	double temp[1200];

	char *name = "db4";
	obj = wave_init(name);
	wave_summary(obj);

	ifp = fopen("../data/signal.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = 177;
	
	fclose(ifp);

	inp = (double*)malloc(sizeof(double)* N);
	out = (double*)malloc(sizeof(double)* N);
	diff = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}
	J = 2;

	wt = wt_init(obj, "modwt", N, J);// Initialize the wavelet transform object
	
	modwt(wt, inp);// Perform MODWT
	//MODWT output can be accessed using wt->output vector. Use wt_summary to find out how to extract appx and detail coefficients
	
	for (i = 0; i < wt->outlength; ++i) {
		printf("%g ",wt->output[i]);
	}

	imodwt(wt, out);// Perform ISWT (if needed)
	// Test Reconstruction


	for (i = 0; i < wt->siglength; ++i) {
		diff[i] = out[i] - inp[i];
	}

	printf("\n MAX %g \n", absmax(diff, wt->siglength));// If Reconstruction succeeded then the output should be a small value.
	
	wt_summary(wt);// Prints the full summary.

	wave_free(obj);
	wt_free(wt);

	free(inp);
	free(out);
	free(diff);
	return 0;
}